

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int openDirectory(char *zFilename,int *pFd)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  uint *puVar4;
  ulong uVar5;
  char zDirname [513];
  char local_228 [528];
  
  sqlite3_snprintf(0x200,local_228,"%s",zFilename);
  uVar2 = strlen(local_228);
  if ((int)uVar2 < 2) {
    iVar1 = -1;
    uVar5 = 1;
    if ((int)uVar2 != 1) goto LAB_0012aff9;
  }
  else {
    do {
      iVar1 = (int)uVar2;
      uVar5 = uVar2 & 0xffffffff;
      if (local_228[uVar5] == '/') goto LAB_0012afcc;
      uVar2 = (ulong)(iVar1 - 1);
    } while (2 < iVar1);
    uVar5 = 1;
  }
LAB_0012afcc:
  local_228[uVar5] = '\0';
  do {
    iVar1 = (*aSyscall[0].pCurrent)(local_228,0x80000,0x1a4);
    if (-1 < iVar1) {
      *pFd = iVar1;
      return 0;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
LAB_0012aff9:
  *pFd = iVar1;
  sqlite3_log(0xe,"cannot open file at line %d of [%.10s]",0x67e1,
              "118a3b35693b134d56ebd780123b7fd6f1497668");
  puVar4 = (uint *)__errno_location();
  sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0x67e1,(ulong)*puVar4,"open",local_228,"");
  return 0xe;
}

Assistant:

static int openDirectory(const char *zFilename, int *pFd){
  int ii;
  int fd = -1;
  char zDirname[MAX_PATHNAME+1];

  sqlite3_snprintf(MAX_PATHNAME, zDirname, "%s", zFilename);
  for(ii=(int)strlen(zDirname); ii>1 && zDirname[ii]!='/'; ii--);
  if( ii>0 ){
    zDirname[ii] = '\0';
    fd = robust_open(zDirname, O_RDONLY|O_BINARY, 0);
    if( fd>=0 ){
      OSTRACE(("OPENDIR %-3d %s\n", fd, zDirname));
    }
  }
  *pFd = fd;
  return (fd>=0?SQLITE_OK:unixLogError(SQLITE_CANTOPEN_BKPT, "open", zDirname));
}